

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

bool __thiscall cmake::Open(cmake *this,string *dir,bool dryRun)

{
  cmState *pcVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  char *pcVar5;
  string *psVar6;
  cmGlobalGenerator *__p;
  pointer pcVar7;
  allocator<char> local_1d9;
  string local_1d8 [39];
  allocator<char> local_1b1;
  string local_1b0;
  char *local_190;
  char *cachedProjectName;
  unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> gen;
  string local_178;
  allocator<char> local_151;
  string local_150;
  undefined1 local_130 [8];
  string fullName;
  string local_108;
  string *local_e8;
  string *extraGenName;
  string local_d8;
  char *local_b8;
  char *genName;
  undefined1 local_a8 [8];
  string cachePath;
  string local_80;
  allocator<char> local_49;
  string local_48;
  byte local_21;
  string *psStack_20;
  bool dryRun_local;
  string *dir_local;
  cmake *this_local;
  
  local_21 = dryRun;
  psStack_20 = dir;
  dir_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"",&local_49);
  SetHomeDirectory(this,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"",(allocator<char> *)(cachePath.field_2._M_local_buf + 0xf));
  SetHomeOutputDirectory(this,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)(cachePath.field_2._M_local_buf + 0xf));
  bVar2 = cmsys::SystemTools::FileIsDirectory(psStack_20);
  if (bVar2) {
    FindCacheFile((string *)local_a8,psStack_20);
    bVar2 = LoadCache(this,(string *)local_a8);
    if (bVar2) {
      pcVar1 = this->State;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d8,"CMAKE_GENERATOR",(allocator<char> *)((long)&extraGenName + 7))
      ;
      pcVar5 = cmState::GetCacheEntryValue(pcVar1,&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&extraGenName + 7));
      local_b8 = pcVar5;
      if (pcVar5 == (char *)0x0) {
        std::operator<<((ostream *)&std::cerr,"Error: could not find CMAKE_GENERATOR in Cache\n");
        this_local._7_1_ = 0;
        genName._4_4_ = 1;
      }
      else {
        pcVar1 = this->State;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_108,"CMAKE_EXTRA_GENERATOR",
                   (allocator<char> *)(fullName.field_2._M_local_buf + 0xf));
        psVar6 = cmState::GetInitializedCacheValue(pcVar1,&local_108);
        std::__cxx11::string::~string((string *)&local_108);
        std::allocator<char>::~allocator((allocator<char> *)(fullName.field_2._M_local_buf + 0xf));
        pcVar5 = local_b8;
        local_e8 = psVar6;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,pcVar5,&local_151);
        gen._M_t.super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>.
        _M_t.super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
        super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl._6_1_ = 0;
        if (local_e8 == (string *)0x0) {
          std::allocator<char>::allocator();
          gen._M_t.super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
          ._M_t.super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
          .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl._6_1_ = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_178,"",
                     (allocator<char> *)
                     ((long)&gen._M_t.
                             super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                             .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl + 7));
        }
        else {
          std::__cxx11::string::string((string *)&local_178,(string *)local_e8);
        }
        cmExternalMakefileProjectGenerator::CreateFullGeneratorName
                  ((string *)local_130,&local_150,&local_178);
        std::__cxx11::string::~string((string *)&local_178);
        if ((gen._M_t.
             super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
             super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
             super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl._6_1_ & 1) != 0) {
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&gen._M_t.
                             super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                             .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl + 7));
        }
        std::__cxx11::string::~string((string *)&local_150);
        std::allocator<char>::~allocator(&local_151);
        __p = CreateGlobalGenerator(this,(string *)local_130);
        std::unique_ptr<cmGlobalGenerator,std::default_delete<cmGlobalGenerator>>::
        unique_ptr<std::default_delete<cmGlobalGenerator>,void>
                  ((unique_ptr<cmGlobalGenerator,std::default_delete<cmGlobalGenerator>> *)
                   &cachedProjectName,__p);
        bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&cachedProjectName);
        if (bVar2) {
          pcVar1 = this->State;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1b0,"CMAKE_PROJECT_NAME",&local_1b1);
          pcVar5 = cmState::GetCacheEntryValue(pcVar1,&local_1b0);
          std::__cxx11::string::~string((string *)&local_1b0);
          std::allocator<char>::~allocator(&local_1b1);
          local_190 = pcVar5;
          if (pcVar5 == (char *)0x0) {
            std::operator<<((ostream *)&std::cerr,
                            "Error: could not find CMAKE_PROJECT_NAME in Cache\n");
            this_local._7_1_ = 0;
          }
          else {
            pcVar7 = std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::
                     operator->((unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                                 *)&cachedProjectName);
            psVar6 = psStack_20;
            pcVar5 = local_190;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>(local_1d8,pcVar5,&local_1d9);
            iVar3 = (*pcVar7->_vptr_cmGlobalGenerator[0x10])
                              (pcVar7,psVar6,local_1d8,(ulong)(local_21 & 1));
            this_local._7_1_ = (byte)iVar3 & 1;
            std::__cxx11::string::~string(local_1d8);
            std::allocator<char>::~allocator(&local_1d9);
          }
        }
        else {
          poVar4 = std::operator<<((ostream *)&std::cerr,"Error: could create CMAKE_GENERATOR \"");
          poVar4 = std::operator<<(poVar4,(string *)local_130);
          std::operator<<(poVar4,"\"\n");
          this_local._7_1_ = 0;
        }
        genName._4_4_ = 1;
        std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::~unique_ptr
                  ((unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> *)
                   &cachedProjectName);
        std::__cxx11::string::~string((string *)local_130);
      }
    }
    else {
      std::operator<<((ostream *)&std::cerr,"Error: could not load cache\n");
      this_local._7_1_ = 0;
      genName._4_4_ = 1;
    }
    std::__cxx11::string::~string((string *)local_a8);
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error: ");
    poVar4 = std::operator<<(poVar4,(string *)psStack_20);
    std::operator<<(poVar4," is not a directory\n");
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmake::Open(const std::string& dir, bool dryRun)
{
  this->SetHomeDirectory("");
  this->SetHomeOutputDirectory("");
  if (!cmSystemTools::FileIsDirectory(dir)) {
    std::cerr << "Error: " << dir << " is not a directory\n";
    return false;
  }

  std::string cachePath = FindCacheFile(dir);
  if (!this->LoadCache(cachePath)) {
    std::cerr << "Error: could not load cache\n";
    return false;
  }
  const char* genName = this->State->GetCacheEntryValue("CMAKE_GENERATOR");
  if (!genName) {
    std::cerr << "Error: could not find CMAKE_GENERATOR in Cache\n";
    return false;
  }
  const std::string* extraGenName =
    this->State->GetInitializedCacheValue("CMAKE_EXTRA_GENERATOR");
  std::string fullName =
    cmExternalMakefileProjectGenerator::CreateFullGeneratorName(
      genName, extraGenName ? *extraGenName : "");

  std::unique_ptr<cmGlobalGenerator> gen(
    this->CreateGlobalGenerator(fullName));
  if (!gen) {
    std::cerr << "Error: could create CMAKE_GENERATOR \"" << fullName
              << "\"\n";
    return false;
  }

  const char* cachedProjectName =
    this->State->GetCacheEntryValue("CMAKE_PROJECT_NAME");
  if (!cachedProjectName) {
    std::cerr << "Error: could not find CMAKE_PROJECT_NAME in Cache\n";
    return false;
  }

  return gen->Open(dir, cachedProjectName, dryRun);
}